

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O3

GLenum __thiscall
gl4cts::anon_unknown_0::ImageLoadStoreDataAlignmentTest::Create2DR8UITexture
          (ImageLoadStoreDataAlignmentTest *this,GLuint width,GLuint height,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *texture_data,GLuint *out_texture_id
          )

{
  uint in_EAX;
  GLenum GVar1;
  CallLogWrapper *this_00;
  ulong uStack_38;
  GLuint texture_id;
  
  uStack_38 = (ulong)in_EAX;
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glGenTextures(this_00,1,&texture_id);
  GVar1 = glu::CallLogWrapper::glGetError(this_00);
  if (GVar1 == 0) {
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,texture_id);
    GVar1 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar1 == 0) {
      glu::CallLogWrapper::glTexImage2D
                (this_00,0xde1,0,0x8232,width,height,0,0x8d94,0x1401,
                 (texture_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start);
      GVar1 = glu::CallLogWrapper::glGetError(this_00);
      if (GVar1 == 0) {
        glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x813c,0);
        glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x813d,0);
        glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
        GVar1 = glu::CallLogWrapper::glGetError(this_00);
        if (GVar1 != 0) {
          glu::CallLogWrapper::glDeleteTextures(this_00,1,&texture_id);
          return GVar1;
        }
        *out_texture_id = texture_id;
        return 0;
      }
    }
    glu::CallLogWrapper::glDeleteTextures(this_00,1,&texture_id);
  }
  return GVar1;
}

Assistant:

GLenum Create2DR8UITexture(GLuint width, GLuint height, const std::vector<GLubyte>& texture_data,
							   GLuint& out_texture_id)
	{
		GLenum err		  = 0;
		GLuint texture_id = 0;

		/* Generate texture */
		glGenTextures(1, &texture_id);
		err = glGetError();
		if (GL_NO_ERROR != err)
		{
			return err;
		}

		/* Bind texture */
		glBindTexture(GL_TEXTURE_2D, texture_id);
		err = glGetError();
		if (GL_NO_ERROR != err)
		{
			glDeleteTextures(1, &texture_id);
			return err;
		}

		/* Allocate storage and fill texture */
		glTexImage2D(GL_TEXTURE_2D, 0 /* level */, GL_R8UI, width, height, 0 /* border */, GL_RED_INTEGER,
					 GL_UNSIGNED_BYTE, &texture_data[0]);
		err = glGetError();
		if (GL_NO_ERROR != err)
		{
			glDeleteTextures(1, &texture_id);
			return err;
		}

		/* Make texture complete */
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_BASE_LEVEL, 0);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAX_LEVEL, 0);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		err = glGetError();
		if (GL_NO_ERROR != err)
		{
			glDeleteTextures(1, &texture_id);
			return err;
		}

		/* Set out_texture_id */
		out_texture_id = texture_id;

		/* Done */
		return GL_NO_ERROR;
	}